

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined1 auVar1 [16];
  ImVec2 IVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  int iVar10;
  ImGuiContext *g;
  uint uVar11;
  bool bVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar27;
  undefined1 in_register_00001208 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar35 [64];
  float fVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float local_e8;
  undefined1 auStack_e4 [12];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  
  pIVar9 = GImGui;
  auVar35._8_56_ = in_register_00001248;
  auVar35._0_8_ = v_max;
  auVar31._8_56_ = in_register_00001208;
  auVar31._0_8_ = v_min;
  uVar11 = data_type & 0xfffffffe;
  uVar13 = (ulong)(flags & 1);
  auVar22 = auVar35._0_16_;
  auVar28 = auVar31._0_16_;
  uVar3 = vcmpsd_avx512f(auVar28,auVar22,1);
  bVar15 = (bool)((byte)uVar3 & 1);
  bVar14 = uVar11 == 8;
  fVar25 = (&(bb->Max).x)[uVar13];
  fVar36 = (&(bb->Min).x)[uVar13];
  bVar12 = power != 1.0;
  dVar27 = v_max - v_min;
  fVar23 = (fVar25 - fVar36) + -4.0;
  dVar17 = (double)((ulong)bVar15 * (long)dVar27 + (ulong)!bVar15 * (long)(v_min - v_max));
  fVar40 = (GImGui->Style).GrabMinSize;
  auVar18 = ZEXT416((uint)fVar40);
  if ((uVar11 != 8) && (0.0 <= dVar17)) {
    dVar37 = (double)fVar23 / (dVar17 + 1.0);
    auVar18._0_4_ = (float)dVar37;
    auVar18._4_4_ = (int)((ulong)dVar37 >> 0x20);
    auVar18._8_8_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar40),auVar18,2);
    bVar15 = (bool)((byte)uVar3 & 1);
    auVar18 = ZEXT416((uint)bVar15 * (int)auVar18._0_4_ + (uint)!bVar15 * (int)fVar40);
  }
  auVar18 = vminss_avx(auVar18,ZEXT416((uint)fVar23));
  if ((!bVar12 || !bVar14) || 0.0 <= v_min * v_max) {
    fVar40 = (float)((uint)(v_min < 0.0) * 0x3f800000);
  }
  else {
    local_e8 = fVar23;
    auVar20._0_8_ = -v_min;
    auVar20._8_8_ = in_register_00001208._0_8_ ^ 0x8000000000000000;
    uVar3 = vcmpsd_avx512f(auVar20,auVar28,2);
    bVar15 = (bool)((byte)uVar3 & 1);
    dVar37 = pow((double)((ulong)bVar15 * (long)v_min + (ulong)!bVar15 * (long)auVar20._0_8_),
                 1.0 / (double)power);
    auVar29._0_8_ = -v_max;
    auVar29._8_8_ = in_register_00001248._0_8_ ^ 0x8000000000000000;
    uVar3 = vcmpsd_avx512f(auVar29,auVar22,2);
    bVar15 = (bool)((byte)uVar3 & 1);
    dVar26 = pow((double)((ulong)bVar15 * (long)v_max + (ulong)!bVar15 * (long)auVar29._0_8_),
                 1.0 / (double)power);
    fVar40 = (float)(dVar37 / (dVar37 + dVar26));
  }
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 + 2.0)),auVar18,SUB6416(ZEXT464(0x3f000000),0));
  fVar36 = auVar20._0_4_;
  local_e8 = fVar23;
  if (pIVar9->ActiveId == id) {
    if (pIVar9->ActiveIdSource == ImGuiInputSource_Nav) {
      auVar33._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar33._8_56_ = extraout_var_01;
      if ((pIVar9->NavActivatePressedId == id) && (pIVar9->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else {
        auVar20 = vmovshdup_avx(auVar33._0_16_);
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        auVar20 = vxorps_avx512vl(auVar20,auVar6);
        fVar16 = (float)((uint)(uVar13 == 0) * (int)auVar33._0_4_ +
                        (uint)(uVar13 != 0) * auVar20._0_4_);
        if ((fVar16 != 0.0) || (NAN(fVar16))) {
          fVar24 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar40);
          if ((uVar11 != 8) ||
             (iVar10 = ImParseFormatPrecision(format,3), (bool)(~(bVar12 && bVar14) & iVar10 < 1)))
          {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = dVar17;
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0x7fffffffffffffff;
            auVar7._12_4_ = 0x7fffffff;
            auVar20 = vandpd_avx512vl(auVar8,auVar7);
            if ((auVar20._0_8_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar16),0xe);
              bVar15 = (bool)((byte)uVar3 & 1);
              fVar16 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * 0x3f800000) /
                       (float)dVar17;
            }
            else {
              fVar16 = fVar16 / 100.0;
            }
          }
          else {
            uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
            bVar15 = (bool)((byte)uVar3 & 1);
            fVar16 = (float)((uint)bVar15 * (int)((fVar16 / 100.0) / 10.0) +
                            (uint)!bVar15 * (int)(fVar16 / 100.0));
          }
          uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
          bVar15 = (bool)((byte)uVar3 & 1);
          fVar16 = (float)((uint)bVar15 * (int)(fVar16 * 10.0) + (uint)!bVar15 * (int)fVar16);
          if (((1.0 <= fVar24) && (0.0 < fVar16)) || ((fVar24 <= 0.0 && (fVar16 < 0.0)))) {
            bVar12 = false;
            goto LAB_002233f9;
          }
          uVar3 = vcmpss_avx512f(ZEXT416((uint)(fVar24 + fVar16)),ZEXT816(0) << 0x40,1);
          auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar24 + fVar16)));
          auVar19._4_12_ = auVar20._4_12_;
          auVar19._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar20._0_4_;
          goto LAB_0022305c;
        }
      }
LAB_00223355:
      bVar12 = false;
      goto LAB_002233f9;
    }
    if (pIVar9->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar9->IO).MouseDown[0] != false) {
        fVar16 = fVar23 - auVar18._0_4_;
        fVar24 = 0.0;
        if (0.0 < fVar16) {
          auVar29 = ZEXT416((uint)((*(float *)((pIVar9->IO).MouseDown + uVar13 * 4 + -8) - fVar36) /
                                  fVar16));
          auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar29);
          uVar3 = vcmpss_avx512f(auVar29,ZEXT816(0) << 0x20,1);
          fVar24 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar20._0_4_);
        }
        auVar19 = ZEXT416((uint)(uVar13 == 0) * (int)fVar24 +
                          (uint)(uVar13 != 0) * (int)(1.0 - fVar24));
LAB_0022305c:
        fVar23 = auVar19._0_4_;
        if (bVar12 && bVar14) {
          if (fVar40 <= fVar23) {
            auVar5._8_4_ = 0x7fffffff;
            auVar5._0_8_ = 0x7fffffff7fffffff;
            auVar5._12_4_ = 0x7fffffff;
            auVar22 = vandps_avx512vl(ZEXT416((uint)(fVar40 + -1.0)),auVar5);
            uVar3 = vcmpss_avx512f(auVar22,ZEXT416(0x358637bd),0xe);
            bVar12 = (bool)((byte)uVar3 & 1);
            auVar34._0_4_ =
                 powf((float)((uint)bVar12 * (int)((fVar23 - fVar40) / (1.0 - fVar40)) +
                             (uint)!bVar12 * (int)fVar23),power);
            auVar34._4_60_ = extraout_var_00;
            auVar20 = auVar34._0_16_;
            uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar28,2);
            auVar21._8_8_ = in_register_00001208._0_8_;
            auVar21._0_8_ = (ulong)((byte)uVar3 & 1) * (long)v_min;
            dVar27 = v_max;
          }
          else {
            auVar32._0_4_ = powf(1.0 - fVar23 / fVar40,power);
            auVar32._4_60_ = extraout_var;
            auVar20 = auVar32._0_16_;
            auVar21 = vminsd_avx(auVar22,ZEXT816(0) << 0x40);
            dVar27 = v_min;
          }
          auVar30._0_8_ = (double)auVar20._0_4_;
          auVar30._8_8_ = auVar20._8_8_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = dVar27 - auVar21._0_8_;
          auVar28 = vfmadd213sd_fma(auVar30,auVar38,auVar21);
          dVar27 = auVar28._0_8_;
        }
        else {
          auVar22._0_8_ = (double)fVar23;
          auVar22._8_8_ = auVar19._8_8_;
          if (uVar11 == 8) {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = dVar27;
            auVar28 = vfmadd132sd_fma(auVar22,auVar28,auVar1);
            dVar27 = auVar28._0_8_;
          }
          else {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = auVar22._0_8_ * dVar27;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = auVar22._0_8_ * dVar27 + 0.5;
            auVar28 = vmaxsd_avx(auVar39,auVar28);
            dVar27 = auVar28._0_8_ + v_min;
          }
        }
        dVar27 = RoundScalarWithFormatT<double,double>(format,data_type,dVar27);
        if ((*v != dVar27) || (NAN(*v) || NAN(dVar27))) {
          bVar12 = true;
          *v = dVar27;
          goto LAB_002233f9;
        }
        goto LAB_00223355;
      }
      ClearActiveID();
    }
  }
  bVar12 = false;
LAB_002233f9:
  if (1.0 <= local_e8) {
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar22 = vxorps_avx512vl(auVar18,auVar4);
    auVar28 = vfnmadd231ss_fma(ZEXT416((uint)(fVar25 + -2.0)),auVar18,SUB6416(ZEXT464(0x3f000000),0)
                              );
    fVar25 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar40);
    bVar15 = uVar13 == 0;
    auVar28 = vfmadd213ss_fma(ZEXT416((uint)(auVar28._0_4_ - fVar36)),
                              ZEXT416((uint)bVar15 * (int)fVar25 +
                                      (uint)!bVar15 * (int)(1.0 - fVar25)),ZEXT416((uint)fVar36));
    if (bVar15) {
      fVar25 = (bb->Min).y;
      fVar36 = (bb->Max).y;
      auVar22 = vfmadd213ss_fma(auVar22,SUB6416(ZEXT464(0x3f000000),0),auVar28);
      auVar18 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x3f000000),0),auVar28);
      (out_grab_bb->Min).x = auVar22._0_4_;
      (out_grab_bb->Min).y = fVar25 + 2.0;
      (out_grab_bb->Max).x = auVar18._0_4_;
      (out_grab_bb->Max).y = fVar36 + -2.0;
    }
    else {
      fVar25 = (bb->Max).x;
      auVar22 = vfmadd213ss_fma(auVar22,SUB6416(ZEXT464(0x3f000000),0),auVar28);
      auVar18 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x3f000000),0),auVar28);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar22._0_4_;
      (out_grab_bb->Max).x = fVar25 + -2.0;
      (out_grab_bb->Max).y = auVar18._0_4_;
    }
  }
  else {
    IVar2 = bb->Min;
    out_grab_bb->Min = IVar2;
    out_grab_bb->Max = IVar2;
  }
  return bVar12;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}